

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<wchar_t> __thiscall
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
          (internal *this,null_terminating_iterator<wchar_t> it,
          specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
          *handler)

{
  uint *puVar1;
  null_terminating_iterator<wchar_t> nVar2;
  null_terminating_iterator<wchar_t> nVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  uint uVar8;
  wchar_t *pwVar9;
  error_handler *peVar10;
  wchar_t wVar11;
  int iVar12;
  precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
  *handler_00;
  wchar_t *pwVar13;
  internal *piVar14;
  byte bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  null_terminating_iterator<wchar_t> it_00;
  null_terminating_iterator<wchar_t> nVar19;
  null_terminating_iterator<wchar_t> nVar20;
  null_terminating_iterator<wchar_t> nVar21;
  wchar_t *local_10;
  
  pwVar13 = it.end_;
  nVar20.ptr_ = (internal *)it.ptr_;
  if (this == nVar20.ptr_) {
    iVar12 = 0;
  }
  else {
    iVar12 = *(int *)this;
  }
  if ((iVar12 == 0) || (iVar12 == 0x7d)) goto LAB_001360aa;
  handler_00 = *(precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                 **)pwVar13;
  wVar11 = pwVar13[4];
  bVar4 = false;
  lVar18 = 1;
  iVar16 = 0;
  do {
    iVar17 = 0;
    if ((internal *)((error_handler *)this + lVar18 * 4) != nVar20.ptr_) {
      iVar17 = *(int *)((error_handler *)this + lVar18 * 4);
    }
    if (iVar17 < 0x3e) {
      if (iVar17 == 0x3c) {
        iVar16 = 1;
      }
      else if (iVar17 == 0x3d) {
        iVar16 = 4;
      }
    }
    else if (iVar17 == 0x3e) {
      iVar16 = 2;
    }
    else if (iVar17 == 0x5e) {
      iVar16 = 3;
    }
    if (iVar16 != 0) {
      if (bVar4) {
        this = (internal *)((error_handler *)this + 4);
      }
      else {
        if (iVar12 == 0x7b) {
          error_handler::on_error((error_handler *)this,"invalid fill character \'{\'");
        }
        this = (internal *)((error_handler *)this + 8);
        *(int *)((long)&((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                          *)handler_00)->handler + 4) = iVar12;
      }
      if ((iVar16 == 4) && (8 < (uint)(wVar11 + L'\xffffffff'))) goto LAB_001360b6;
      *(int *)&((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                 *)handler_00)[1].handler = iVar16;
    }
    bVar15 = ~bVar4;
    lVar18 = 0;
    bVar4 = true;
  } while ((bool)(bVar15 & iVar16 == 0));
  if (this == nVar20.ptr_) {
    iVar12 = 0;
  }
  else {
    iVar12 = *(int *)this;
  }
  if (iVar12 == 0x20) {
    wVar11 = pwVar13[4];
    uVar8 = wVar11 + L'\xffffffff';
    if (8 < uVar8) goto LAB_001360b6;
    uVar7 = 1;
LAB_00135e97:
    if ((uVar8 < 7) && ((7 < (uint)wVar11 || ((0x94U >> (wVar11 & 0x1fU) & 1) == 0)))) {
      error_handler::on_error((error_handler *)this,"format specifier requires signed argument");
    }
    handler_00 = *(precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                   **)pwVar13;
    puVar1 = (uint *)((long)&((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                               *)handler_00)[1].handler + 4);
    *puVar1 = *puVar1 | uVar7;
    this = (internal *)((error_handler *)this + 4);
  }
  else {
    if (iVar12 == 0x2d) {
      wVar11 = pwVar13[4];
      uVar8 = wVar11 + L'\xffffffff';
      if (8 < uVar8) goto LAB_001360b6;
      uVar7 = 4;
      goto LAB_00135e97;
    }
    if (iVar12 == 0x2b) {
      wVar11 = pwVar13[4];
      uVar8 = wVar11 + L'\xffffffff';
      if (8 < uVar8) goto LAB_001360b6;
      uVar7 = 3;
      goto LAB_00135e97;
    }
  }
  pwVar9 = (wchar_t *)0x0;
  if ((this != nVar20.ptr_) && (*(int *)this == 0x23)) {
    if (8 < (uint)(pwVar13[4] + L'\xffffffff')) goto LAB_001360b6;
    pwVar9 = *(wchar_t **)pwVar13;
    pwVar9[3] = pwVar9[3] | 8;
    this = this + 4;
  }
  if ((this != nVar20.ptr_) && (*(int *)this == 0x30)) {
    if (8 < (uint)(pwVar13[4] + L'\xffffffff')) {
LAB_001360b6:
      error_handler::on_error((error_handler *)this,"format specifier requires numeric argument");
    }
    pwVar9 = *(wchar_t **)pwVar13;
    handler_00 = (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                  *)0x400000030;
    pwVar9[1] = L'0';
    pwVar9[2] = L'\x04';
    this = this + 4;
  }
  nVar3.end_ = (wchar_t *)nVar20.ptr_;
  nVar3.ptr_ = pwVar9;
  nVar2.end_ = (wchar_t *)nVar20.ptr_;
  nVar2.ptr_ = pwVar9;
  nVar19.end_ = (wchar_t *)nVar20.ptr_;
  nVar19.ptr_ = pwVar9;
  if (this != nVar20.ptr_) {
    if ((*(int *)this < 0x30) || ((this != nVar20.ptr_ && (0x39 < *(int *)this)))) {
      nVar19 = nVar2;
      if ((this != nVar20.ptr_) && (nVar19 = nVar3, *(int *)this == 0x7b)) {
        piVar14 = this + 4;
        nVar20.end_ = (wchar_t *)&local_10;
        local_10 = pwVar13;
        nVar19 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                           (piVar14,nVar20,
                            (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                             *)handler_00);
        it_00.ptr_ = (error_handler *)nVar19.ptr_;
        if ((it_00.ptr_ == (error_handler *)nVar19.end_) ||
           (piVar14 = (internal *)it_00.ptr_, *(int *)it_00.ptr_ != 0x7d)) goto LAB_001360e6;
        this = (internal *)(it_00.ptr_ + 4);
      }
    }
    else {
      pwVar9 = (wchar_t *)0x0;
      piVar14 = this;
      do {
        this = piVar14 + 4;
        if (piVar14 == nVar20.ptr_) {
          iVar12 = -0x30;
        }
        else {
          iVar12 = *(int *)piVar14 + -0x30;
        }
        uVar8 = (int)pwVar9 * 10 + iVar12;
        pwVar9 = (wchar_t *)(ulong)uVar8;
        if ((this == nVar20.ptr_) || (9 < *(int *)this - 0x30U)) goto LAB_00135f6c;
        piVar14 = this;
      } while (uVar8 < 0xccccccd);
      pwVar9 = (wchar_t *)0x80000000;
LAB_00135f6c:
      nVar19.ptr_ = pwVar9;
      if ((int)pwVar9 < 0) goto LAB_001360f2;
      handler_00 = *(precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>_&,_wchar_t>
                     **)pwVar13;
      *(int *)&handler_00->handler = (int)pwVar9;
    }
  }
  it_00.ptr_ = (error_handler *)nVar19.end_;
  if ((this != (internal *)it_00.ptr_) && (*(int *)this == 0x2e)) {
    peVar10 = (error_handler *)this + 4;
    if (peVar10 == it_00.ptr_) {
LAB_001360da:
      error_handler::on_error((error_handler *)this,"missing precision specifier");
    }
    if ((*(int *)peVar10 < 0x30) || ((peVar10 != it_00.ptr_ && (0x39 < *(int *)peVar10)))) {
      if ((peVar10 == it_00.ptr_) || (*(int *)peVar10 != 0x7b)) goto LAB_001360da;
      piVar14 = (internal *)((error_handler *)this + 8);
      it_00.end_ = (wchar_t *)&local_10;
      local_10 = pwVar13;
      nVar20 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<wchar_t>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&,wchar_t>>
                         (piVar14,it_00,handler_00);
      it_00.ptr_ = (error_handler *)nVar20.end_;
      peVar10 = (error_handler *)nVar20.ptr_;
      if ((peVar10 == it_00.ptr_) || (piVar14 = (internal *)peVar10, *(int *)peVar10 != 0x7d)) {
LAB_001360e6:
        error_handler::on_error((error_handler *)piVar14,"invalid format string");
      }
      this = (internal *)(peVar10 + 4);
    }
    else {
      uVar8 = 0;
      peVar10 = (error_handler *)this + 8;
      do {
        this = (internal *)peVar10;
        if ((error_handler *)this + -4 == it_00.ptr_) {
          iVar12 = -0x30;
        }
        else {
          iVar12 = *(int *)((error_handler *)this + -4) + -0x30;
        }
        uVar8 = uVar8 * 10 + iVar12;
        if ((this == (internal *)it_00.ptr_) || (9 < *(int *)this - 0x30U)) goto LAB_00136027;
        peVar10 = (error_handler *)this + 4;
      } while (uVar8 < 0xccccccd);
      uVar8 = 0x80000000;
LAB_00136027:
      if ((int)uVar8 < 0) {
LAB_001360f2:
        error_handler::on_error((error_handler *)this,"number is too big");
      }
      *(uint *)(*(long *)pwVar13 + 0x10) = uVar8;
    }
    auVar5._8_8_ = 0;
    auVar5._0_8_ = it_00.ptr_;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = it_00.ptr_;
    nVar19 = (null_terminating_iterator<wchar_t>)(auVar5 << 0x40);
    if (((uint)pwVar13[4] < 0xd) &&
       (nVar19 = (null_terminating_iterator<wchar_t>)(auVar6 << 0x40),
       (0x10feU >> (pwVar13[4] & 0x1fU) & 1) != 0)) {
      error_handler::on_error((error_handler *)this,"precision not allowed for this argument type");
    }
  }
  nVar20.ptr_ = (internal *)nVar19.end_;
  if ((((this != nVar20.ptr_) && (this != nVar20.ptr_)) && (*(int *)this != 0x7d)) &&
     (*(int *)this != 0)) {
    if (this == nVar20.ptr_) {
      iVar12 = 0;
    }
    else {
      iVar12 = *(int *)this;
    }
    this = this + 4;
    *(int *)(*(long *)pwVar13 + 0x14) = iVar12;
  }
LAB_001360aa:
  nVar21.end_ = (wchar_t *)nVar20.ptr_;
  nVar21.ptr_ = (wchar_t *)this;
  return nVar21;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}